

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalHashJoin::Finalize
          (PhysicalHashJoin *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
  *this_00;
  unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
  *this_01;
  vector<duckdb::JoinCondition,_true> *this_02;
  HashJoinGlobalSinkState *this_03;
  pointer puVar1;
  byte bVar2;
  type this_04;
  pointer pTVar3;
  idx_t iVar4;
  idx_t iVar5;
  type pJVar6;
  ClientContext *context_00;
  PhysicalOperator *op;
  pointer pDVar7;
  reference pvVar8;
  const_reference pvVar9;
  pointer pEVar10;
  pointer pPVar11;
  reference other;
  pointer this_05;
  SinkFinalizeType SVar12;
  long lVar13;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *local_ht;
  pointer puVar14;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *local_ht_1;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> final_min_max;
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
  *__range3;
  value_type key_type;
  LogicalType local_f0;
  Value min;
  shared_ptr<duckdb::Event,_true> local_98;
  Value max;
  LogicalType local_48;
  
  this_03 = (HashJoinGlobalSinkState *)input->global_state;
  this_04 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
            operator*(&this_03->hash_table);
  this_00 = &this_03->temporary_memory_state;
  pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  TemporaryMemoryState::UpdateReservation(pTVar3,context);
  pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  iVar4 = TemporaryMemoryState::GetReservation(pTVar3);
  bVar15 = iVar4 < this_03->total_size;
  this_03->external = bVar15;
  if (bVar15) {
    this_04->load_factor = 1.5;
    iVar4 = JoinHashTable::GetTotalSize
                      (this_04,&this_03->local_hash_tables,(idx_t *)&min,(idx_t *)&max);
    pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(this_00);
    iVar5 = TemporaryMemoryState::GetReservation(pTVar3);
    if (iVar4 < iVar5) {
      pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      TemporaryMemoryState::SetMinimumReservation(pTVar3,iVar4);
      pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      TemporaryMemoryState::SetRemainingSizeAndUpdateReservation(pTVar3,context,iVar4);
      this_03->total_size = iVar4;
      this_03->max_partition_size = min.type_._0_8_;
      this_03->max_partition_count = max.type_._0_8_;
      this_03->external = false;
    }
    else if ((this_03->external & 1U) != 0) {
      ::std::
      __uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
      ::reset((__uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
               *)&this_03->perfect_join_executor,(pointer)0x0);
      iVar4 = this_03->max_partition_size;
      iVar5 = JoinHashTable::PointerTableSize(this_04,this_03->max_partition_count);
      lVar13 = iVar5 + iVar4;
      auVar16._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = 0x45300000;
      iVar4 = this_03->total_size;
      auVar17._8_4_ = (int)(iVar4 >> 0x20);
      auVar17._0_8_ = iVar4;
      auVar17._12_4_ = 0x45300000;
      if ((auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0) <
          ((auVar17._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0)) * 0.8) {
        iVar4 = this_03->probe_side_requirement;
        pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                 ::operator->(this_00);
        iVar5 = TemporaryMemoryState::GetReservation(pTVar3);
        if (iVar5 < lVar13 + iVar4) {
          pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                   ::operator->(this_00);
          iVar4 = TemporaryMemoryState::GetReservation(pTVar3);
          JoinHashTable::SetRepartitionRadixBits
                    (this_04,iVar4,this_03->max_partition_size,this_03->max_partition_count);
          make_shared_ptr<duckdb::HashJoinRepartitionEvent,duckdb::Pipeline&,duckdb::PhysicalHashJoin_const&,duckdb::HashJoinGlobalSinkState&,duckdb::vector<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>,true>&>
                    ((Pipeline *)&min,(PhysicalHashJoin *)pipeline,(HashJoinGlobalSinkState *)this,
                     (vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
                      *)this_03);
          local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)min.type_._0_8_;
          local_98.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               min.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          min.type_.id_ = INVALID;
          min.type_.physical_type_ = ~INVALID;
          min.type_._2_6_ = 0;
          min.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          Event::InsertEvent(event,&local_98);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_98.internal.
                      super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&min.type_.type_info_);
          goto LAB_009b5017;
        }
      }
      puVar1 = (this_03->local_hash_tables).
               super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar14 = (this_03->local_hash_tables).
                     super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar1;
          puVar14 = puVar14 + 1) {
        pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                 ::operator*(puVar14);
        JoinHashTable::Merge(this_04,pJVar6);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
      ::clear(&(this_03->local_hash_tables).
               super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             );
      this_05 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator->(&this_03->hash_table);
      pTVar3 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      iVar4 = TemporaryMemoryState::GetReservation(pTVar3);
      JoinHashTable::PrepareExternalFinalize(this_05,iVar4 - this_03->probe_side_requirement);
      HashJoinGlobalSinkState::ScheduleFinalize(this_03,pipeline,event);
LAB_009b5017:
      this_03->finalized = true;
      return READY;
    }
  }
  puVar1 = (this_03->local_hash_tables).
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (this_03->local_hash_tables).
                 super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar1; puVar14 = puVar14 + 1
      ) {
    pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator*(puVar14);
    JoinHashTable::Merge(this_04,pJVar6);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ::clear(&(this_03->local_hash_tables).
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
         );
  JoinHashTable::Unpartition(this_04);
  LogicalType::LogicalType(&local_48,SQLNULL);
  Value::Value(&min,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_f0,SQLNULL);
  Value::Value(&max,&local_f0);
  LogicalType::~LogicalType(&local_f0);
  if ((((this->super_PhysicalComparisonJoin).filter_pushdown.
        super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl ==
        (JoinFilterPushdownInfo *)0x0) || (this_03->skip_filter_pushdown != false)) ||
     (iVar4 = JoinHashTable::Count(this_04), iVar4 == 0)) {
    this_02 = &(this->super_PhysicalComparisonJoin).conditions;
    pvVar9 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,0);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pvVar9->right);
    bVar15 = TypeIsIntegral((pEVar10->return_type).physical_type_);
    if (bVar15) {
      pvVar9 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar9->right);
      Value::MinimumValue((Value *)&key_type,&pEVar10->return_type);
      Value::operator=(&min,(Value *)&key_type);
      Value::~Value((Value *)&key_type);
      pvVar9 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar9->right);
      Value::MaximumValue((Value *)&key_type,&pEVar10->return_type);
      Value::operator=(&max,(Value *)&key_type);
      Value::~Value((Value *)&key_type);
    }
  }
  else {
    context_00 = (ClientContext *)
                 unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                 ::operator->(&(this->super_PhysicalComparisonJoin).filter_pushdown);
    op = (PhysicalOperator *)
         unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
         ::operator*(&this_03->global_filter_state);
    JoinFilterPushdownInfo::Finalize
              ((JoinFilterPushdownInfo *)&final_min_max,context_00,(JoinHashTable *)context,
               (JoinFilterGlobalState *)this_04,op);
    pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (&final_min_max);
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&pDVar7->data,0);
    Vector::GetValue((Value *)&key_type,pvVar8,0);
    Value::operator=(&min,(Value *)&key_type);
    Value::~Value((Value *)&key_type);
    pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (&final_min_max);
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&pDVar7->data,1);
    Vector::GetValue((Value *)&key_type,pvVar8,0);
    Value::operator=(&max,(Value *)&key_type);
    Value::~Value((Value *)&key_type);
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              (&final_min_max.
                super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
  }
  this_01 = &this_03->perfect_join_executor;
  pPVar11 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
            ::operator->(this_01);
  bVar15 = PerfectHashJoinExecutor::CanDoPerfectHashJoin(pPVar11,this,&min,&max);
  if (bVar15) {
    other = vector<duckdb::LogicalType,_true>::get<true>(&this_04->equality_types,0);
    LogicalType::LogicalType(&key_type,other);
    pPVar11 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
              ::operator->(this_01);
    bVar15 = PerfectHashJoinExecutor::BuildPerfectHashTable(pPVar11,&key_type);
    LogicalType::~LogicalType(&key_type);
    if (bVar15) goto LAB_009b4f41;
  }
  ::std::
  __uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ::reset((__uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           *)this_01,(pointer)0x0);
  HashJoinGlobalSinkState::ScheduleFinalize(this_03,pipeline,event);
LAB_009b4f41:
  this_03->finalized = true;
  iVar4 = JoinHashTable::Count(this_04);
  if ((iVar4 == 0) &&
     (bVar2 = (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
              field_0x81 - 2, bVar2 < 9)) {
    SVar12 = (&DAT_0106066e)[bVar2];
  }
  else {
    SVar12 = READY;
  }
  Value::~Value(&max);
  Value::~Value(&min);
  return SVar12;
}

Assistant:

SinkFinalizeType PhysicalHashJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                            OperatorSinkFinalizeInput &input) const {
	auto &sink = input.global_state.Cast<HashJoinGlobalSinkState>();
	auto &ht = *sink.hash_table;

	sink.temporary_memory_state->UpdateReservation(context);
	sink.external = sink.temporary_memory_state->GetReservation() < sink.total_size;
	if (sink.external) {
		// For external join we reduce the load factor, this may even prevent the external join altogether
		ht.load_factor = JoinHashTable::EXTERNAL_LOAD_FACTOR;

		idx_t temp_max_partition_size;
		idx_t temp_max_partition_count;
		idx_t temp_total_size =
		    ht.GetTotalSize(sink.local_hash_tables, temp_max_partition_size, temp_max_partition_count);

		if (temp_total_size < sink.temporary_memory_state->GetReservation()) {
			// We prevented the external join by reducing the load factor. Update the state accordingly
			sink.temporary_memory_state->SetMinimumReservation(temp_total_size);
			sink.temporary_memory_state->SetRemainingSizeAndUpdateReservation(context, temp_total_size);

			sink.total_size = temp_total_size;
			sink.max_partition_size = temp_max_partition_size;
			sink.max_partition_count = temp_max_partition_count;

			sink.external = false;
		}
	}
	if (sink.external) {
		// External Hash Join
		sink.perfect_join_executor.reset();

		const auto max_partition_ht_size = sink.max_partition_size + ht.PointerTableSize(sink.max_partition_count);
		const auto very_very_skewed = // No point in repartitioning if it's this skewed
		    static_cast<double>(max_partition_ht_size) >= 0.8 * static_cast<double>(sink.total_size);
		if (!very_very_skewed &&
		    (max_partition_ht_size + sink.probe_side_requirement) > sink.temporary_memory_state->GetReservation()) {
			// We have to repartition
			ht.SetRepartitionRadixBits(sink.temporary_memory_state->GetReservation(), sink.max_partition_size,
			                           sink.max_partition_count);
			auto new_event = make_shared_ptr<HashJoinRepartitionEvent>(pipeline, *this, sink, sink.local_hash_tables);
			event.InsertEvent(std::move(new_event));
		} else {
			// No repartitioning!
			for (auto &local_ht : sink.local_hash_tables) {
				ht.Merge(*local_ht);
			}
			sink.local_hash_tables.clear();
			D_ASSERT(sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
			sink.hash_table->PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() -
			                                         sink.probe_side_requirement);
			sink.ScheduleFinalize(pipeline, event);
		}
		sink.finalized = true;
		return SinkFinalizeType::READY;
	}

	// In-memory Hash Join
	for (auto &local_ht : sink.local_hash_tables) {
		ht.Merge(*local_ht);
	}
	sink.local_hash_tables.clear();
	ht.Unpartition();

	Value min;
	Value max;
	if (filter_pushdown && !sink.skip_filter_pushdown && ht.Count() > 0) {
		auto final_min_max = filter_pushdown->Finalize(context, ht, *sink.global_filter_state, *this);
		min = final_min_max->data[0].GetValue(0);
		max = final_min_max->data[1].GetValue(0);
	} else if (TypeIsIntegral(conditions[0].right->return_type.InternalType())) {
		min = Value::MinimumValue(conditions[0].right->return_type);
		max = Value::MaximumValue(conditions[0].right->return_type);
	}

	// check for possible perfect hash table
	auto use_perfect_hash = sink.perfect_join_executor->CanDoPerfectHashJoin(*this, min, max);
	if (use_perfect_hash) {
		D_ASSERT(ht.equality_types.size() == 1);
		auto key_type = ht.equality_types[0];
		use_perfect_hash = sink.perfect_join_executor->BuildPerfectHashTable(key_type);
	}
	// In case of a large build side or duplicates, use regular hash join
	if (!use_perfect_hash) {
		sink.perfect_join_executor.reset();
		sink.ScheduleFinalize(pipeline, event);
	}
	sink.finalized = true;
	if (ht.Count() == 0 && EmptyResultIfRHSIsEmpty()) {
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}
	return SinkFinalizeType::READY;
}